

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_quaternion rf_quaternion_from_matrix(rf_mat mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  rf_quaternion rVar6;
  float in_stack_00000008;
  float in_stack_0000000c;
  
  fVar3 = in_stack_00000008 + mat.m12 + mat.m2 + mat.m7;
  if (fVar3 <= 0.0) {
    if ((in_stack_00000008 <= mat.m12) || (in_stack_00000008 <= mat.m2)) {
      if (mat.m12 <= mat.m2) {
        fVar3 = ((mat.m2 + 1.0) - in_stack_00000008) - mat.m12;
        if (fVar3 < 0.0) {
          fVar3 = sqrtf(fVar3);
        }
        else {
          fVar3 = SQRT(fVar3);
        }
        fVar5 = 1.0 / (fVar3 + fVar3);
        fVar1 = (mat.m8 - in_stack_0000000c) * fVar5;
        fVar2 = (mat.m0 + mat.m9) * fVar5;
        fVar5 = (mat.m1 + mat.m13) * fVar5;
        fVar3 = (fVar3 + fVar3) * 0.25;
        goto LAB_00123cc1;
      }
      fVar3 = ((mat.m12 + 1.0) - in_stack_00000008) - mat.m2;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      fVar4 = 1.0 / (fVar3 + fVar3);
      fVar1 = (mat.m0 - mat.m9) * fVar4;
      fVar2 = (in_stack_0000000c + mat.m8) * fVar4;
      fVar5 = (fVar3 + fVar3) * 0.25;
      fVar3 = mat.m1 + mat.m13;
    }
    else {
      fVar3 = ((in_stack_00000008 + 1.0) - mat.m12) - mat.m2;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      fVar4 = 1.0 / (fVar3 + fVar3);
      fVar1 = (mat.m13 - mat.m1) * fVar4;
      fVar2 = (fVar3 + fVar3) * 0.25;
      fVar5 = (in_stack_0000000c + mat.m8) * fVar4;
      fVar3 = mat.m0 + mat.m9;
    }
  }
  else {
    fVar3 = fVar3 + 1.0;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar4 = 1.0 / (fVar3 + fVar3);
    fVar1 = (fVar3 + fVar3) * 0.25;
    fVar2 = (mat.m13 - mat.m1) * fVar4;
    fVar5 = (mat.m0 - mat.m9) * fVar4;
    fVar3 = mat.m8 - in_stack_0000000c;
  }
  fVar3 = fVar3 * fVar4;
LAB_00123cc1:
  rVar6.w = fVar1;
  rVar6.z = fVar3;
  rVar6.y = fVar5;
  rVar6.x = fVar2;
  return rVar6;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_matrix(rf_mat mat)
{
    rf_quaternion result = {0};

    float trace = rf_mat_trace(mat);

    if (trace > 0.0f)
    {
        float s = (float) sqrt(trace + 1) * 2.0f;
        float invS = 1.0f / s;

        result.w = s * 0.25f;
        result.x = (mat.m6 - mat.m9) * invS;
        result.y = (mat.m8 - mat.m2) * invS;
        result.z = (mat.m1 - mat.m4) * invS;
    } else
    {
        float m00 = mat.m0, m11 = mat.m5, m22 = mat.m10;

        if (m00 > m11 && m00 > m22)
        {
            float s = (float) sqrt(1.0f + m00 - m11 - m22) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m6 - mat.m9) * invS;
            result.x = s * 0.25f;
            result.y = (mat.m4 + mat.m1) * invS;
            result.z = (mat.m8 + mat.m2) * invS;
        } else if (m11 > m22)
        {
            float s = (float) sqrt(1.0f + m11 - m00 - m22) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m8 - mat.m2) * invS;
            result.x = (mat.m4 + mat.m1) * invS;
            result.y = s * 0.25f;
            result.z = (mat.m9 + mat.m6) * invS;
        } else
        {
            float s = (float) sqrt(1.0f + m22 - m00 - m11) * 2.0f;
            float invS = 1.0f / s;

            result.w = (mat.m1 - mat.m4) * invS;
            result.x = (mat.m8 + mat.m2) * invS;
            result.y = (mat.m9 + mat.m6) * invS;
            result.z = s * 0.25f;
        }
    }

    return result;
}